

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

bool M_Responder(event_t *ev)

{
  int iVar1;
  uint uVar2;
  byte local_41;
  FName local_30;
  FName local_2c;
  byte local_25;
  uint local_24;
  bool fromcontroller;
  int mkey;
  bool keyup;
  event_t *peStack_18;
  int ch;
  event_t *ev_local;
  
  mkey = 0;
  fromcontroller = false;
  local_24 = 9;
  local_25 = 1;
  if (chatmodeon != 0) {
    return false;
  }
  peStack_18 = ev;
  if ((DMenu::CurrentMenu == (DMenu *)0x0) || (menuactive == MENU_Off)) {
    if (MenuEnabled) {
      if (ev->type == '\x01') {
        if (ev->data1 == 1) {
          M_StartControlPanel(true);
          FName::FName(&local_2c,NAME_Mainmenu);
          M_SetMenu(&local_2c,-1);
          return true;
        }
        if ((devparm) && (ev->data1 == 0x3b)) {
          G_ScreenShot((char *)0x0);
          return true;
        }
        return false;
      }
      if ((((ev->type == '\x04') && (ev->subtype == '\a')) && (ConsoleState != c_down)) &&
         (iVar1 = FIntCVar::operator_cast_to_int(&m_use_mouse), iVar1 != 0)) {
        M_StartControlPanel(true);
        FName::FName(&local_30,NAME_Mainmenu);
        M_SetMenu(&local_30,-1);
        return true;
      }
    }
    return false;
  }
  if (ev->type == '\x04') {
    local_25 = 0;
    if (ev->subtype == '\x02') {
      return true;
    }
    if ((ev->subtype == '\x14') || (ev->subtype == '\x15')) {
      local_24 = 7;
      fromcontroller = ev->subtype == '\x15';
    }
    else {
      if ((ev->subtype != '\x01') && (ev->subtype != '\x03')) {
        if ((4 < ev->subtype) &&
           ((ev->subtype < 0x19 &&
            (iVar1 = FIntCVar::operator_cast_to_int(&m_use_mouse), iVar1 == 0)))) {
          return true;
        }
        iVar1 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[7])
                          (DMenu::CurrentMenu,peStack_18);
        return (bool)((byte)iVar1 & 1);
      }
      uVar2 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xc])();
      if ((uVar2 & 1) != 0) {
        mkey = (int)peStack_18->data1;
        fromcontroller = peStack_18->subtype == '\x03';
        switch(mkey) {
        case 1:
          local_24 = 5;
          break;
        case 2:
          local_24 = 4;
          break;
        default:
          if (!fromcontroller) {
            iVar1 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[7])
                              (DMenu::CurrentMenu,peStack_18);
            return (bool)((byte)iVar1 & 1);
          }
          break;
        case 5:
          local_24 = 2;
          break;
        case 6:
          local_24 = 3;
          break;
        case 8:
          local_24 = 8;
          break;
        case 10:
          local_24 = 1;
          break;
        case 0xb:
          local_24 = 0;
          break;
        case 0xd:
          local_24 = 6;
          break;
        case 0x1b:
          local_24 = 7;
          break;
        case 0x1e:
          local_24 = 7;
        }
      }
    }
  }
  else if ((menuactive != MENU_WaitKey) && ((ev->type == '\x01' || (ev->type == '\x02')))) {
    fromcontroller = ev->type == '\x02';
    mkey = (int)ev->data1;
    switch(mkey) {
    case 0x108:
    case 0x1c1:
      local_24 = 7;
      break;
    case 0x109:
    case 0x1c0:
      local_24 = 6;
      break;
    case 0x10a:
    case 0x1c2:
      local_24 = 8;
      break;
    case 0x10c:
    case 0x1bc:
      local_24 = 4;
      break;
    case 0x10d:
    case 0x1bd:
      local_24 = 5;
      break;
    case 0x110:
    case 0x188:
    case 0x19f:
    case 0x1af:
    case 0x1b4:
      local_24 = 0;
      break;
    case 0x111:
    case 0x18a:
    case 0x19e:
    case 0x1ae:
    case 0x1b5:
      local_24 = 1;
      break;
    case 0x112:
    case 0x18b:
    case 0x19d:
    case 0x1ad:
    case 0x1b6:
      local_24 = 2;
      break;
    case 0x113:
    case 0x189:
    case 0x19c:
    case 0x1ac:
    case 0x1b7:
      local_24 = 3;
    }
  }
  if (local_24 == 9) {
    uVar2 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[7])(DMenu::CurrentMenu,peStack_18);
    local_41 = 1;
    if ((uVar2 & 1) == 0) {
      local_41 = fromcontroller ^ 0xff;
    }
    return (bool)(local_41 & 1);
  }
  if ((fromcontroller & 1U) != 0) {
    FButtonStatus::ReleaseKey(MenuButtons + (int)local_24,mkey);
    return false;
  }
  FButtonStatus::PressKey(MenuButtons + (int)local_24,mkey);
  MenuButtonOrigin[(int)local_24] = (bool)(local_25 & 1);
  if ((int)local_24 < 6) {
    MenuButtonTickers[(int)local_24] = 0xe;
  }
  (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[8])
            (DMenu::CurrentMenu,(ulong)local_24,(ulong)local_25 & 1);
  return true;
}

Assistant:

bool M_Responder (event_t *ev) 
{ 
	int ch = 0;
	bool keyup = false;
	int mkey = NUM_MKEYS;
	bool fromcontroller = true;

	if (chatmodeon)
	{
		return false;
	}

	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		// There are a few input sources we are interested in:
		//
		// EV_KeyDown / EV_KeyUp : joysticks/gamepads/controllers
		// EV_GUI_KeyDown / EV_GUI_KeyUp : the keyboard
		// EV_GUI_Char : printable characters, which we want in string input mode
		//
		// This code previously listened for EV_GUI_KeyRepeat to handle repeating
		// in the menus, but that doesn't work with gamepads, so now we combine
		// the multiple inputs into buttons and handle the repetition manually.
		if (ev->type == EV_GUI_Event)
		{
			fromcontroller = false;
			if (ev->subtype == EV_GUI_KeyRepeat)
			{
				// We do our own key repeat handling but still want to eat the
				// OS's repeated keys.
				return true;
			}
			else if (ev->subtype == EV_GUI_BackButtonDown || ev->subtype == EV_GUI_BackButtonUp)
			{
				mkey = MKEY_Back;
				keyup = ev->subtype == EV_GUI_BackButtonUp;
			}
			else if (ev->subtype != EV_GUI_KeyDown && ev->subtype != EV_GUI_KeyUp)
			{
				// do we want mouse input?
				if (ev->subtype >= EV_GUI_FirstMouseEvent && ev->subtype <= EV_GUI_LastMouseEvent)
				{
						if (!m_use_mouse)
							return true;
				}

				// pass everything else on to the current menu
				return DMenu::CurrentMenu->Responder(ev);
			}
			else if (DMenu::CurrentMenu->TranslateKeyboardEvents())
			{
				ch = ev->data1;
				keyup = ev->subtype == EV_GUI_KeyUp;
				switch (ch)
				{
				case GK_BACK:			mkey = MKEY_Back;		break;
				case GK_ESCAPE:			mkey = MKEY_Back;		break;
				case GK_RETURN:			mkey = MKEY_Enter;		break;
				case GK_UP:				mkey = MKEY_Up;			break;
				case GK_DOWN:			mkey = MKEY_Down;		break;
				case GK_LEFT:			mkey = MKEY_Left;		break;
				case GK_RIGHT:			mkey = MKEY_Right;		break;
				case GK_BACKSPACE:		mkey = MKEY_Clear;		break;
				case GK_PGUP:			mkey = MKEY_PageUp;		break;
				case GK_PGDN:			mkey = MKEY_PageDown;	break;
				default:
					if (!keyup)
					{
						return DMenu::CurrentMenu->Responder(ev);
					}
					break;
				}
			}
		}
		else if (menuactive != MENU_WaitKey && (ev->type == EV_KeyDown || ev->type == EV_KeyUp))
		{
			keyup = ev->type == EV_KeyUp;

			ch = ev->data1;
			switch (ch)
			{
			case KEY_JOY2:
//			case KEY_JOY3:
//			case KEY_JOY15:
			case KEY_PAD_A:
				mkey = MKEY_Enter;
				break;

			case KEY_JOY1:
//			case KEY_JOY14:
			case KEY_PAD_B:
				mkey = MKEY_Back;
				break;

//			case KEY_JOY4:
			case KEY_JOY3:
			case KEY_PAD_X:
				mkey = MKEY_Clear;
				break;

			case KEY_JOY5:
			case KEY_PAD_LSHOULDER:
				mkey = MKEY_PageUp;
				break;

			case KEY_JOY6:
			case KEY_PAD_RSHOULDER:
				mkey = MKEY_PageDown;
				break;

			case KEY_PAD_DPAD_UP:
			case KEY_PAD_LTHUMB_UP:
			case KEY_JOYAXIS2MINUS:
			case KEY_JOYPOV1_UP:
			case KEY_JOY9:
				mkey = MKEY_Up;
				break;

			case KEY_PAD_DPAD_DOWN:
			case KEY_PAD_LTHUMB_DOWN:
			case KEY_JOYAXIS2PLUS:
			case KEY_JOYPOV1_DOWN:
			case KEY_JOY10:
				mkey = MKEY_Down;
				break;

			case KEY_PAD_DPAD_LEFT:
			case KEY_PAD_LTHUMB_LEFT:
			case KEY_JOYAXIS1MINUS:
			case KEY_JOYPOV1_LEFT:
			case KEY_JOY11:
				mkey = MKEY_Left;
				break;

			case KEY_PAD_DPAD_RIGHT:
			case KEY_PAD_LTHUMB_RIGHT:
			case KEY_JOYAXIS1PLUS:
			case KEY_JOYPOV1_RIGHT:
			case KEY_JOY12:
				mkey = MKEY_Right;
				break;
			}
		}

		if (mkey != NUM_MKEYS)
		{
			if (keyup)
			{
				MenuButtons[mkey].ReleaseKey(ch);
				return false;
			}
			else
			{
				MenuButtons[mkey].PressKey(ch);
				MenuButtonOrigin[mkey] = fromcontroller;
				if (mkey <= MKEY_PageDown)
				{
					MenuButtonTickers[mkey] = KEY_REPEAT_DELAY;
				}
				DMenu::CurrentMenu->MenuEvent(mkey, fromcontroller);
				return true;
			}
		}
		return DMenu::CurrentMenu->Responder(ev) || !keyup;
	}
	else if (MenuEnabled)
	{
		if (ev->type == EV_KeyDown)
		{
			// Pop-up menu?
			if (ev->data1 == KEY_ESCAPE)
			{
				M_StartControlPanel(true);
				M_SetMenu(NAME_Mainmenu, -1);
				return true;
			}
			// If devparm is set, pressing F1 always takes a screenshot no matter
			// what it's bound to. (for those who don't bother to read the docs)
			if (devparm && ev->data1 == KEY_F1)
			{
				G_ScreenShot(NULL);
				return true;
			}
			return false;
		}
		else if (ev->type == EV_GUI_Event && ev->subtype == EV_GUI_LButtonDown && 
				 ConsoleState != c_down && m_use_mouse)
		{
			M_StartControlPanel(true);
			M_SetMenu(NAME_Mainmenu, -1);
			return true;
		}
	}
	return false;
}